

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norms.h
# Opt level: O0

CompositionPair * __thiscall icu_63::Norm::getCompositionPairs(Norm *this,int32_t *length)

{
  int32_t iVar1;
  int32_t *length_local;
  Norm *this_local;
  
  if (this->compositions == (UVector32 *)0x0) {
    *length = 0;
    this_local = (Norm *)0x0;
  }
  else {
    iVar1 = UVector32::size(this->compositions);
    *length = iVar1 / 2;
    this_local = (Norm *)UVector32::getBuffer(this->compositions);
  }
  return (CompositionPair *)this_local;
}

Assistant:

const CompositionPair *getCompositionPairs(int32_t &length) const {
        if(compositions==nullptr) {
            length=0;
            return nullptr;
        } else {
            length=compositions->size()/2;
            return reinterpret_cast<const CompositionPair *>(compositions->getBuffer());
        }
    }